

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

void __thiscall Server::handNewConn(Server *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  uint fd;
  int iVar4;
  EventLoop *loop;
  HttpData *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 auStack_98 [8];
  sockaddr_in client_addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  socklen_t local_44;
  long lStack_40;
  socklen_t client_addr_len;
  shared_ptr<HttpData> req_info;
  
  auStack_98._0_2_ = 0;
  auStack_98[2] = '\0';
  auStack_98[3] = '\0';
  auStack_98[4] = '\0';
  auStack_98[5] = '\0';
  auStack_98[6] = '\0';
  auStack_98[7] = '\0';
  client_addr.sin_family = 0;
  client_addr.sin_port = 0;
  client_addr.sin_addr.s_addr = 0;
  local_44 = 0x10;
  fd = accept(this->listenFd_,(sockaddr *)auStack_98,&local_44);
  if (0 < (int)fd) {
    do {
      loop = EventLoopThreadPool::getNextLoop
                       ((this->eventLoopThreadPool_)._M_t.
                        super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
                        .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
      if (fd < 100000) {
        iVar4 = setSocketNonBlocking(fd);
        if (iVar4 < 0) {
          return;
        }
        setSocketNodelay(fd);
        this_01 = (HttpData *)operator_new(0x2c0);
        HttpData::HttpData(this_01,loop,fd);
        std::__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpData,void>
                  ((__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
                   this_01);
        lVar2 = *(long *)(lStack_40 + 0x18);
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lStack_40 + 0x20);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_70._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &((req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpData>)._M_weak_this.
                      super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &((req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpData>)._M_weak_this.
                      super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        *(long *)(lVar2 + 0x18) = lStack_40;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x20),&local_70);
        if ((element_type *)local_70._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        peVar3 = req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar2 = lStack_40;
        if (req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &((req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpData>)._M_weak_this.
                      super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &((req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpData>)._M_weak_this.
                      super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        local_58 = (code *)0x0;
        pcStack_50 = (code *)0x0;
        local_68._M_unused._M_object = (void *)0x0;
        local_68._8_8_ = 0;
        local_68._M_unused._M_object = operator_new(0x20);
        *(code **)local_68._M_unused._0_8_ = HttpData::newEvent;
        *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
        *(long *)((long)local_68._M_unused._0_8_ + 0x10) = lVar2;
        *(element_type **)((long)local_68._M_unused._0_8_ + 0x18) = peVar3;
        pcStack_50 = std::
                     _Function_handler<void_(),_std::_Bind<void_(HttpData::*(std::shared_ptr<HttpData>))()>_>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(),_std::_Bind<void_(HttpData::*(std::shared_ptr<HttpData>))()>_>
                   ::_M_manager;
        EventLoop::queueInLoop(loop,(Functor *)&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        if (req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        close(fd);
      }
      fd = accept(this->listenFd_,(sockaddr *)auStack_98,&local_44);
    } while (0 < (int)fd);
  }
  ((this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ =
       0x80000001;
  return;
}

Assistant:

void Server::handNewConn() {
  struct sockaddr_in client_addr;
  memset(&client_addr, 0, sizeof(struct sockaddr_in));
  socklen_t client_addr_len = sizeof(client_addr);
  int accept_fd = 0;
  while ((accept_fd = accept(listenFd_, (struct sockaddr *)&client_addr,
                             &client_addr_len)) > 0) {
    EventLoop *loop = eventLoopThreadPool_->getNextLoop();
    //LOG << "New connection from " << inet_ntoa(client_addr.sin_addr) << ":"
    //    << ntohs(client_addr.sin_port) << " fd : " << accept_fd;
    // cout << "new connection" << endl;
    // cout << inet_ntoa(client_addr.sin_addr) << endl;
    // cout << ntohs(client_addr.sin_port) << endl;
    /*
    // TCP的保活机制默认是关闭的
    int optval = 0;
    socklen_t len_optval = 4;
    getsockopt(accept_fd, SOL_SOCKET,  SO_KEEPALIVE, &optval, &len_optval);
    cout << "optval ==" << optval << endl;
    */
    // 限制服务器的最大并发连接数
    if (accept_fd >= MAXFDS) {
      close(accept_fd);
      continue;
    }
    // 设为非阻塞模式
    if (setSocketNonBlocking(accept_fd) < 0) {
      //LOG << "Set non block failed!";
      // perror("Set non block failed!");
      return;
    }

    setSocketNodelay(accept_fd);
    // setSocketNoLinger(accept_fd);

    shared_ptr<HttpData> req_info(new HttpData(loop, accept_fd));
    req_info->getChannel()->setHolder(req_info);
    loop->queueInLoop(std::bind(&HttpData::newEvent, req_info));
  }
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
}